

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O2

QByteArrayList * QDecompressHelper::acceptedEncoding(void)

{
  QList<QByteArray> *in_RDI;
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QByteArray *)0x0;
  (in_RDI->d).size = 0;
  QList<QByteArray>::reserve(in_RDI,4);
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    QByteArrayView::toByteArray
              ((QByteArray *)&local_40,
               (QByteArrayView *)((long)&(anonymous_namespace)::contentEncodingMapping + lVar1));
    QList<QByteArray>::emplaceBack<QByteArray>(in_RDI,(QByteArray *)&local_40);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArrayList QDecompressHelper::acceptedEncoding()
{
    QByteArrayList list;
    list.reserve(std::size(contentEncodingMapping));
    for (const auto &mapping : contentEncodingMapping) {
        list << mapping.name.toByteArray();
    }
    return list;
}